

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

VarSlice * __thiscall kratos::Var::operator[](Var *this,pair<unsigned_int,_unsigned_int> slice)

{
  uint *puVar1;
  pointer psVar2;
  VarSlice *pVVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  VarException *pVVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::VarSlice> *s;
  pointer psVar11;
  basic_string_view<char> bVar12;
  shared_ptr<kratos::VarSlice> sVar13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  pair<unsigned_int,_unsigned_int> local_a8;
  vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
  *local_a0;
  Var *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  int local_88;
  undefined1 local_84 [4];
  undefined1 local_80 [8];
  shared_ptr<kratos::PackedSlice> packed_slice;
  VarSlice *local_60;
  undefined1 local_58 [8];
  shared_ptr<kratos::VarSlice> var_slice;
  
  uVar6 = slice.first;
  local_a8 = slice;
  local_98 = this;
  if (uVar6 < slice.second) {
    pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)slice & 0xffffffff);
    local_58 = (undefined1  [8])((ulong)slice >> 0x20);
    bVar12 = fmt::v7::to_string_view<char,_0>("low ({0}) cannot be larger than ({1})");
    format_str_00.data_ = (char *)bVar12.size_;
    format_str_00.size_ = 0x22;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_80,(detail *)bVar12.data_,format_str_00,args_00);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_98;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58,
               __l_00,(allocator_type *)&local_60);
    VarException::VarException
              (pVVar9,(string *)local_80,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58);
    __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = *puVar1;
  if (uVar5 == 1 &&
      (long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 4) {
    uVar5 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
    if (uVar5 <= uVar6) {
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      uVar6 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
      local_58 = (undefined1  [8])((ulong)slice & 0xffffffff);
      var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
      bVar12 = fmt::v7::to_string_view<char,_0>("high ({0}) has to be smaller than width ({1})");
      format_str.data_ = (char *)bVar12.size_;
      format_str.size_ = 0x22;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_58;
      fmt::v7::detail::vformat_abi_cxx11_((string *)local_80,(detail *)bVar12.data_,format_str,args)
      ;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_98;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                 ,__l,(allocator_type *)&local_60);
      VarException::VarException
                (pVVar9,(string *)local_80,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                );
      __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (uVar5 <= uVar6) {
    pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
    local_58 = (undefined1  [8])((ulong)slice & 0xffffffff);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)*(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    bVar12 = fmt::v7::to_string_view<char,_0>("high ({0}) has to be smaller than size ({1})");
    format_str_01.data_ = (char *)bVar12.size_;
    format_str_01.size_ = 0x22;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_80,(detail *)bVar12.data_,format_str_01,args_01);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_98;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58,
               __l_01,(allocator_type *)&local_60);
    VarException::VarException
              (pVVar9,(string *)local_80,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58);
    __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = (vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&this->slices_;
  psVar11 = (this->slices_).
            super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar11 == psVar2) {
      local_80 = (undefined1  [8])this;
      sVar13 = std::
               make_shared<kratos::VarSlice,kratos::Var*,unsigned_int_const&,unsigned_int_const&>
                         ((Var **)local_58,(uint *)local_80,&local_a8.first);
      if (this->width_param_ != (Var *)0x0) {
        (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[0x23])
                  (local_58,this->width_param_,
                   sVar13.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      iVar7 = (*(this->super_IRNode)._vptr_IRNode[0x29])(this);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0xb8))
                        ((long *)CONCAT44(extraout_var,iVar7));
      if ((cVar4 == '\0') ||
         (uVar8 = (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[7])(),
         uVar8 != ((Var *)local_58)->var_width_)) {
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
                  (local_a0,(shared_ptr<kratos::VarSlice> *)local_58);
      }
      else {
        iVar7 = (*(this->super_IRNode)._vptr_IRNode[0x29])(this);
        if (CONCAT44(extraout_var_00,iVar7) == 0) {
          plVar10 = (long *)0x0;
        }
        else {
          plVar10 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar7),&typeinfo,
                                           &PackedInterface::typeinfo,0xfffffffffffffffe);
        }
        local_60 = (VarSlice *)local_58;
        local_88 = (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[7])();
        local_88 = local_88 + -1;
        local_84 = (undefined1  [4])0x0;
        (**(code **)(*plVar10 + 0x10))(&local_98,plVar10);
        std::
        make_shared<kratos::PackedSlice,kratos::VarSlice*,unsigned_int,int,kratos::PackedStruct*>
                  ((VarSlice **)local_80,(uint *)&local_60,&local_88,(PackedStruct **)local_84);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  (local_a0,(shared_ptr<kratos::PackedSlice> *)local_80);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)((long)local_80 + 0x188),(shared_ptr<kratos::VarSlice> *)local_58);
        std::__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2> *)local_58,
                   (__shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2> *)local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_slice);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice);
      return (VarSlice *)local_58;
    }
    iVar7 = (*(((psVar11->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((((char)iVar7 == '\0') &&
        (pVVar3 = (psVar11->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        , pVVar3->high == uVar6)) && (pVVar3->low == slice.second)) break;
    psVar11 = psVar11 + 1;
  }
  return pVVar3;
}

Assistant:

VarSlice &Var::operator[](std::pair<uint32_t, uint32_t> slice) {
    auto const [high, low] = slice;
    if (low > high) {
        throw VarException(::format("low ({0}) cannot be larger than ({1})", low, high), {this});
    }
    // if the size is not 1, we are slicing off size, not width
    if (size_.size() == 1 && size_.front() == 1) {
        if (high >= width()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than width ({1})", high, width()), {this});
        }
    } else {
        if (high >= size_.front()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than size ({1})", high, size_.front()),
                {this});
        }
    }
    // if there is one already
    for (auto const &s : slices_) {
        if (!s->sliced_by_var()) {
            if (high == s->high && low == s->low) return *s;
        }
    }
    // create a new one
    // notice that slice is not part of generator's variables. It's handled by the parent (var)
    // itself
    std::shared_ptr<VarSlice> var_slice = ::make_shared<VarSlice>(this, high, low);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    // depends on the root variable, if it is actually a struct, we need to return to the
    // actual trampoline class as proxy
    if (get_var_root_parent()->is_struct() && var_slice->width() == var_slice->var_width()) {
        // we actually reached the real struct
        auto *s = dynamic_cast<PackedInterface *>(get_var_root_parent());
        auto packed_slice = std::make_shared<PackedSlice>(var_slice.get(), var_slice->width() - 1,
                                                          0, s->packed_struct().get());
        slices_.emplace_back(packed_slice);
        // this is a hack here, but we store the parent into the child
        packed_slice->slices_.emplace_back(var_slice);
        var_slice = packed_slice;
    } else {
        slices_.emplace_back(var_slice);
    }

    return *var_slice;
}